

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

bool __thiscall
crnlib::dxt1_endpoint_optimizer::evaluate_solution_fast
          (dxt1_endpoint_optimizer *this,dxt1_solution_coordinates *coords,bool alternate_rounding)

{
  ushort uVar1;
  params *ppVar2;
  unique_color *puVar3;
  ulong uVar4;
  long lVar5;
  dxt1_endpoint_optimizer *pdVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  uint i;
  uint uVar10;
  byte bVar11;
  undefined7 in_register_00000011;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_d8;
  undefined4 local_d4;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  dxt1_endpoint_optimizer *local_c8;
  ulong local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  ulong local_a8;
  ulong local_a0;
  vector<unsigned_char> *local_98;
  uint local_8c;
  uint local_88;
  undefined1 local_84 [12];
  vector<unsigned_char> *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  potential_solution *local_40;
  ulong local_38;
  
  local_c0 = CONCAT44(local_c0._4_4_,(int)CONCAT71(in_register_00000011,alternate_rounding));
  (this->m_trial_solution).m_coords = *coords;
  local_78 = &(this->m_trial_solution).m_selectors;
  vector<unsigned_char>::resize(local_78,(this->m_unique_colors).m_size,false);
  (this->m_trial_solution).m_error = (this->m_best_solution).m_error;
  (this->m_trial_solution).m_alpha_block = false;
  ppVar2 = this->m_pParams;
  uVar8 = 1;
  if (ppVar2->m_pixels_have_alpha == false) {
    uVar15 = 1;
    if (ppVar2->m_force_alpha_blocks == false) {
      uVar8 = (uint)ppVar2->m_use_alpha_blocks;
      uVar15 = 0;
    }
  }
  else {
    uVar15 = 1;
  }
  local_84._4_8_ = &this->m_trial_solution;
  local_40 = &this->m_best_solution;
  local_98 = &this->m_trial_selectors;
  local_c8 = this;
  vector<unsigned_char>::resize(local_98,(this->m_unique_colors).m_size,false);
  dxt1_block::unpack_color((dxt1_block *)local_84,coords->m_low_color,true,0xff);
  uVar7 = local_84._0_4_;
  local_d8.m_u32 = local_84._0_4_;
  dxt1_block::unpack_color((dxt1_block *)local_84,coords->m_high_color,true,0xff);
  local_d4 = local_84._0_4_;
  uVar17 = (local_84._0_4_ & 0xff) - (uVar7 & 0xff);
  uVar10 = (uint)local_84._0_4_ >> 8 & 0xff;
  uVar14 = (uint)uVar7 >> 8 & 0xff;
  uVar19 = uVar10 - uVar14;
  uVar20 = (uint)local_84._0_4_ >> 0x10 & 0xff;
  uVar12 = (uint)uVar7 >> 0x10 & 0xff;
  uVar21 = uVar20 - uVar12;
  local_58 = (ulong)uVar21;
  bVar24 = this->m_perceptual == false;
  uVar18 = uVar19 * 0x18;
  if (bVar24) {
    uVar18 = uVar19;
  }
  local_60 = (ulong)uVar18;
  uVar19 = uVar17 * 8;
  if (bVar24) {
    uVar19 = uVar17;
  }
  local_68 = (ulong)uVar19;
  local_48 = (ulong)(uVar12 * uVar21 + (uVar7 & 0xff) * uVar19 + uVar14 * uVar18);
  local_50 = (ulong)(uVar20 * uVar21 + (local_84._0_4_ & 0xff) * uVar19 + uVar10 * uVar18);
  local_ac = uVar19 * 2;
  local_b0 = uVar18 * 2;
  local_b4 = uVar21 * 2;
  local_70 = local_c0 & 0xff;
  local_8c = uVar8;
  do {
    if (uVar8 < uVar15) {
      if (((local_c8->m_trial_solution).m_alpha_block == false) &&
         (uVar1 = (local_c8->m_trial_solution).m_coords.m_low_color,
         uVar1 == (local_c8->m_trial_solution).m_coords.m_high_color)) {
        bVar24 = (~uVar1 & 0x1f) != 0;
        if (bVar24) {
          ((dxt1_solution_coordinates *)local_84._4_8_)->m_low_color = uVar1 + 1;
        }
        else {
          (local_c8->m_trial_solution).m_coords.m_high_color = uVar1 - 1;
        }
        for (uVar23 = 0; uVar23 < (local_c8->m_unique_colors).m_size; uVar23 = uVar23 + 1) {
          local_78->m_p[uVar23] = bVar24;
        }
      }
      uVar23 = (local_c8->m_trial_solution).m_error;
      uVar4 = (local_c8->m_best_solution).m_error;
      if (uVar23 < uVar4) {
        potential_solution::operator=(local_40,(potential_solution *)local_84._4_8_);
      }
      return uVar23 < uVar4;
    }
    uVar8 = local_d8.m_u32 & 0xff;
    iVar16 = (int)local_70;
    local_88 = uVar15;
    if (uVar15 == 0) {
      uVar15 = ((local_d4 & 0xff) + iVar16 + uVar8 * 2 & 0xffff) / 3;
      uVar18 = ((uint)local_d4._1_1_ + iVar16 + (uint)local_d8.field_0.g * 2 & 0xffff) / 3;
      uVar10 = ((uint)local_d4._2_1_ + iVar16 + (uint)local_d8.field_0.b * 2 & 0xffff) / 3;
      local_d0 = (undefined1)uVar15;
      local_cf = (undefined1)uVar18;
      local_ce = (undefined1)uVar10;
      local_cd = 0xff;
      uVar8 = (uVar8 + iVar16 + (local_d4 & 0xff) * 2 & 0xffff) / 3;
      uVar12 = ((uint)local_d8.field_0.g + iVar16 + (uint)local_d4._1_1_ * 2 & 0xffff) / 3;
      uVar14 = ((uint)local_d8.field_0.b + iVar16 + (uint)local_d4._2_1_ * 2 & 0xffff) / 3;
      local_cc = (undefined1)uVar8;
      local_cb = (undefined1)uVar12;
      local_ca = (undefined1)uVar14;
      local_c9 = 0xff;
      iVar22 = (uVar10 & 0xff) * (int)local_58 +
               (uVar18 & 0xff) * (int)local_60 + (uVar15 & 0xff) * (int)local_68;
      iVar16 = (uVar14 & 0xff) * (int)local_58 +
               (uVar12 & 0xff) * (int)local_60 + (uVar8 & 0xff) * (int)local_68;
      local_a8 = CONCAT44(local_a8._4_4_,(int)local_50 + iVar16);
      local_a0 = (ulong)(uint)(iVar16 + iVar22);
      local_c0 = CONCAT44(local_c0._4_4_,iVar22 + (int)local_48);
      uVar8 = (local_c8->m_unique_colors).m_size;
      local_38 = (ulong)uVar8;
      lVar13 = -1;
      uVar23 = 0;
      lVar5 = local_38 * 8;
      for (; pdVar6 = local_c8, 0 < (int)uVar8; uVar8 = uVar8 - 1) {
        puVar3 = (local_c8->m_unique_colors).m_p;
        iVar16 = (uint)puVar3[-1].m_color.field_0.c[lVar5 + 2] * local_b4 +
                 (uint)puVar3[-1].m_color.field_0.c[lVar5 + 1] * local_b0 +
                 (uint)puVar3[-1].m_color.field_0.c[lVar5] * local_ac;
        bVar11 = (iVar16 < (int)local_a8) * '\x02' + 1;
        if (iVar16 < (int)local_a0) {
          bVar11 = ((int)local_c0 <= iVar16) * '\x02';
        }
        uVar9 = color_distance(local_c8,local_c8->m_perceptual,
                               (color_quad_u8 *)((long)&puVar3[-1].m_color.field_0 + lVar5),
                               (color_quad_u8 *)&(&local_d8)[bVar11].field_0,false);
        uVar23 = uVar23 + (ulong)*(uint *)((long)&(pdVar6->m_unique_colors).m_p[-1].m_weight + lVar5
                                          ) * (ulong)uVar9;
        if ((pdVar6->m_trial_solution).m_error <= uVar23) break;
        local_98->m_p[lVar13 + local_38] = bVar11;
        lVar13 = lVar13 + -1;
        lVar5 = lVar5 + -8;
      }
    }
    else {
      uVar18 = uVar8 + iVar16 + (local_d4 & 0xff) >> 1;
      uVar8 = (uint)local_d8.field_0.g + iVar16 + (uint)local_d4._1_1_ >> 1;
      uVar15 = (uint)local_d8.field_0.b + iVar16 + (uint)local_d4._2_1_ >> 1;
      local_d0 = (undefined1)uVar18;
      local_cf = (undefined1)uVar8;
      local_ce = (undefined1)uVar15;
      local_cd = 0xff;
      iVar16 = (uVar15 & 0xff) * (int)local_58 +
               (uVar8 & 0xff) * (int)local_60 + (uVar18 & 0xff) * (int)local_68;
      local_a0 = CONCAT44(local_a0._4_4_,(int)local_48 + iVar16);
      local_c0 = (ulong)(uint)(iVar16 + (int)local_50);
      uVar8 = (local_c8->m_unique_colors).m_size;
      local_a8 = (ulong)uVar8;
      lVar13 = -1;
      uVar23 = 0;
      lVar5 = local_a8 * 8;
      for (; pdVar6 = local_c8, 0 < (int)uVar8; uVar8 = uVar8 - 1) {
        puVar3 = (local_c8->m_unique_colors).m_p;
        iVar16 = (uint)puVar3[-1].m_color.field_0.c[lVar5 + 2] * local_b4 +
                 (uint)puVar3[-1].m_color.field_0.c[lVar5 + 1] * local_b0 +
                 (uint)puVar3[-1].m_color.field_0.c[lVar5] * local_ac;
        bVar11 = (iVar16 < (int)local_c0) + 1;
        if (iVar16 < (int)local_a0) {
          bVar11 = 0;
        }
        uVar9 = color_distance(local_c8,local_c8->m_perceptual,
                               (color_quad_u8 *)((long)&puVar3[-1].m_color.field_0 + lVar5),
                               (color_quad_u8 *)&(&local_d8)[bVar11].field_0,false);
        uVar23 = uVar23 + (ulong)*(uint *)((long)&(pdVar6->m_unique_colors).m_p[-1].m_weight + lVar5
                                          ) * (ulong)uVar9;
        if ((pdVar6->m_trial_solution).m_error <= uVar23) break;
        local_98->m_p[lVar13 + local_a8] = bVar11;
        lVar13 = lVar13 + -1;
        lVar5 = lVar5 + -8;
      }
    }
    uVar15 = local_88;
    uVar8 = local_8c;
    if (uVar23 < (local_c8->m_trial_solution).m_error) {
      (local_c8->m_trial_solution).m_error = uVar23;
      (local_c8->m_trial_solution).m_alpha_block = local_88 != 0;
      vector<unsigned_char>::operator=(local_78,local_98);
    }
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

bool dxt1_endpoint_optimizer::evaluate_solution_fast(const dxt1_solution_coordinates& coords, bool alternate_rounding)
    {
        m_trial_solution.m_coords = coords;
        m_trial_solution.m_selectors.resize(m_unique_colors.size());
        m_trial_solution.m_error = m_best_solution.m_error;
        m_trial_solution.m_alpha_block = false;

        uint first_block_type = 0;
        uint last_block_type = 1;

        if ((m_pParams->m_pixels_have_alpha) || (m_pParams->m_force_alpha_blocks))
        {
            first_block_type = 1;
        }
        else if (!m_pParams->m_use_alpha_blocks)
        {
            last_block_type = 0;
        }

        m_trial_selectors.resize(m_unique_colors.size());

        color_quad_u8 colors[cDXT1SelectorValues];
        colors[0] = dxt1_block::unpack_color(coords.m_low_color, true);
        colors[1] = dxt1_block::unpack_color(coords.m_high_color, true);

        int vr = colors[1].r - colors[0].r;
        int vg = colors[1].g - colors[0].g;
        int vb = colors[1].b - colors[0].b;
        if (m_perceptual)
        {
            vr *= 8;
            vg *= 24;
        }

        int stops[4];
        stops[0] = colors[0].r * vr + colors[0].g * vg + colors[0].b * vb;
        stops[1] = colors[1].r * vr + colors[1].g * vg + colors[1].b * vb;

        int dirr = vr * 2;
        int dirg = vg * 2;
        int dirb = vb * 2;

        for (uint block_type = first_block_type; block_type <= last_block_type; block_type++)
        {
            uint64 trial_error = 0;

            if (!block_type)
            {
                colors[2].set_noclamp_rgba((colors[0].r * 2 + colors[1].r + alternate_rounding) / 3, (colors[0].g * 2 + colors[1].g + alternate_rounding) / 3, (colors[0].b * 2 + colors[1].b + alternate_rounding) / 3, 255U);
                colors[3].set_noclamp_rgba((colors[1].r * 2 + colors[0].r + alternate_rounding) / 3, (colors[1].g * 2 + colors[0].g + alternate_rounding) / 3, (colors[1].b * 2 + colors[0].b + alternate_rounding) / 3, 255U);

                stops[2] = colors[2].r * vr + colors[2].g * vg + colors[2].b * vb;
                stops[3] = colors[3].r * vr + colors[3].g * vg + colors[3].b * vb;

                // 0 2 3 1
                int c0Point = stops[1] + stops[3];
                int halfPoint = stops[3] + stops[2];
                int c3Point = stops[2] + stops[0];

                for (int unique_color_index = (int)m_unique_colors.size() - 1; unique_color_index >= 0; unique_color_index--)
                {
                    const color_quad_u8& c = m_unique_colors[unique_color_index].m_color;

                    int dot = c.r * dirr + c.g * dirg + c.b * dirb;

                    uint8 best_color_index;
                    if (dot >= halfPoint)
                    {
                        best_color_index = (dot < c0Point) ? 3 : 1;
                    }
                    else
                    {
                        best_color_index = (dot < c3Point) ? 0 : 2;
                    }

                    uint best_error = color_distance(m_perceptual, c, colors[best_color_index], false);

                    trial_error += best_error * static_cast<uint64>(m_unique_colors[unique_color_index].m_weight);
                    if (trial_error >= m_trial_solution.m_error)
                    {
                        break;
                    }

                    m_trial_selectors[unique_color_index] = static_cast<uint8>(best_color_index);
                }
            }
            else
            {
                colors[2].set_noclamp_rgba((colors[0].r + colors[1].r + alternate_rounding) >> 1, (colors[0].g + colors[1].g + alternate_rounding) >> 1, (colors[0].b + colors[1].b + alternate_rounding) >> 1, 255U);

                stops[2] = colors[2].r * vr + colors[2].g * vg + colors[2].b * vb;

                // 0 2 1
                int c02Point = stops[0] + stops[2];
                int c21Point = stops[2] + stops[1];

                for (int unique_color_index = (int)m_unique_colors.size() - 1; unique_color_index >= 0; unique_color_index--)
                {
                    const color_quad_u8& c = m_unique_colors[unique_color_index].m_color;

                    int dot = c.r * dirr + c.g * dirg + c.b * dirb;

                    uint8 best_color_index;
                    if (dot < c02Point)
                    {
                        best_color_index = 0;
                    }
                    else if (dot < c21Point)
                    {
                        best_color_index = 2;
                    }
                    else
                    {
                        best_color_index = 1;
                    }

                    uint best_error = color_distance(m_perceptual, c, colors[best_color_index], false);

                    trial_error += best_error * static_cast<uint64>(m_unique_colors[unique_color_index].m_weight);
                    if (trial_error >= m_trial_solution.m_error)
                    {
                        break;
                    }

                    m_trial_selectors[unique_color_index] = static_cast<uint8>(best_color_index);
                }
            }

            if (trial_error < m_trial_solution.m_error)
            {
                m_trial_solution.m_error = trial_error;
                m_trial_solution.m_alpha_block = (block_type != 0);
                m_trial_solution.m_selectors = m_trial_selectors;
            }
        }

        if ((!m_trial_solution.m_alpha_block) && (m_trial_solution.m_coords.m_low_color == m_trial_solution.m_coords.m_high_color))
        {
            uint s;
            if ((m_trial_solution.m_coords.m_low_color & 31) != 31)
            {
                m_trial_solution.m_coords.m_low_color++;
                s = 1;
            }
            else
            {
                m_trial_solution.m_coords.m_high_color--;
                s = 0;
            }

            for (uint i = 0; i < m_unique_colors.size(); i++)
            {
                m_trial_solution.m_selectors[i] = static_cast<uint8>(s);
            }
        }

        if (m_trial_solution.m_error < m_best_solution.m_error)
        {
            m_best_solution = m_trial_solution;
            return true;
        }

        return false;
    }